

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

void __thiscall
QFileSystemModelPrivate::removeNode
          (QFileSystemModelPrivate *this,QFileSystemNode *parentNode,QString *name)

{
  int iVar1;
  QModelIndex *pQVar2;
  uint uVar3;
  QFileSystemNode *this_00;
  uint uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QStringView QVar6;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QModelIndex **)&this->field_0x8;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  bVar5 = false;
  index((QFileSystemModelPrivate *)local_58,(char *)this,(int)parentNode);
  if (&this->root != parentNode) {
    bVar5 = true;
    if ((-1 < (int)local_58._0_4_) && (-1 < (long)local_58._0_8_)) {
      bVar5 = local_48 == (undefined1 *)0x0;
    }
  }
  QVar6.m_data = (name->d).ptr;
  QVar6.m_size = (name->d).size;
  uVar3 = QtPrivate::QStringList_indexOf
                    ((QList_conflict *)&parentNode->visibleChildren,QVar6,0,CaseSensitive);
  if (-1 < (int)uVar3 && !bVar5) {
    uVar4 = uVar3;
    if (this->sortOrder != AscendingOrder) {
      iVar1 = parentNode->dirtyChildrenIndex;
      if (iVar1 == -1) {
        uVar4 = ~uVar3 + (int)(parentNode->visibleChildren).d.size;
      }
      else if ((int)uVar3 < iVar1) {
        uVar4 = iVar1 + ~uVar3;
      }
    }
    QAbstractItemModel::beginRemoveRows(pQVar2,(int)local_58,uVar4);
  }
  this_00 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::takeImpl<QString>
                      (&parentNode->children,name);
  if (this_00 != (QFileSystemNode *)0x0) {
    QFileSystemNode::~QFileSystemNode(this_00);
    operator_delete(this_00,0x50);
  }
  if ((-1 < (int)uVar3) &&
     (QList<QString>::removeAt(&parentNode->visibleChildren,(ulong)(uVar3 & 0x7fffffff)), !bVar5)) {
    QAbstractItemModel::endRemoveRows();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::removeNode(QFileSystemModelPrivate::QFileSystemNode *parentNode, const QString& name)
{
    Q_Q(QFileSystemModel);
    QModelIndex parent = index(parentNode);
    bool indexHidden = isHiddenByFilter(parentNode, parent);

    int vLocation = parentNode->visibleLocation(name);
    if (vLocation >= 0 && !indexHidden)
        q->beginRemoveRows(parent, translateVisibleLocation(parentNode, vLocation),
                                       translateVisibleLocation(parentNode, vLocation));
    QFileSystemNode * node = parentNode->children.take(name);
    delete node;
    // cleanup sort files after removing rather then re-sorting which is O(n)
    if (vLocation >= 0)
        parentNode->visibleChildren.removeAt(vLocation);
    if (vLocation >= 0 && !indexHidden)
        q->endRemoveRows();
}